

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_jsgf2fsg.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  cmd_ln_t *config;
  char *pcVar2;
  char *pcVar3;
  jsgf_t *grammar;
  jsgf_rule_t *rule;
  logmath_t *lmath;
  fsg_model_t *fsg;
  char *pcVar4;
  long ln;
  
  config = cmd_ln_parse_r((ps_config_t *)0x0,defn,argc,argv,1);
  if (config == (cmd_ln_t *)0x0) {
    err_set_loglevel(ERR_INFO);
    cmd_ln_log_help_r((ps_config_t *)0x0,defn);
    return 1;
  }
  iVar1 = ps_config_bool(config,"help");
  if (iVar1 != 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_jsgf2fsg.c"
            ,0x5f,"Usage: %s -jsgf <input.jsgf> -toprule <rule name>\\\n",*argv);
    err_msg(ERR_INFO,(char *)0x0,0,"\t[-fsm yes/no] [-compile yes/no]\n");
    err_msg(ERR_INFO,(char *)0x0,0,"\t-fsg <output.fsg>\n");
    exit(0);
  }
  pcVar2 = ps_config_str(config,"loglevel");
  if ((pcVar2 != (char *)0x0) && (pcVar3 = err_set_loglevel_str(pcVar2), pcVar3 == (char *)0x0)) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_jsgf2fsg.c"
            ,0x9b,"Invalid log level: %s\n",pcVar2);
    return -1;
  }
  pcVar2 = ps_config_str(config,"jsgf");
  grammar = jsgf_parse_file(pcVar2,(jsgf_t *)0x0);
  iVar1 = 1;
  if (grammar == (jsgf_t *)0x0) {
    return 1;
  }
  pcVar2 = ps_config_str(config,"toprule");
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = ps_config_str(config,"toprule");
  }
  if (pcVar2 == (char *)0x0) {
    rule = jsgf_get_public_rule(grammar);
    if (rule == (jsgf_rule_t *)0x0) {
      pcVar3 = jsgf_grammar_name(grammar);
      pcVar4 = "No public rules found in grammar %s\n";
      ln = 0x77;
      goto LAB_001046ef;
    }
    pcVar3 = jsgf_rule_name(rule);
    pcVar4 = jsgf_grammar_name(grammar);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_jsgf2fsg.c"
            ,0x7c,
            "No -toprule was given; grabbing the first public rule: \'%s\' of the grammar \'%s\'.\n"
            ,pcVar3,pcVar4);
  }
  else {
    rule = jsgf_get_rule(grammar,pcVar2);
    if (rule == (jsgf_rule_t *)0x0) {
      pcVar4 = "Start rule %s not found\n";
      ln = 0x71;
      pcVar3 = pcVar2;
LAB_001046ef:
      fsg = (fsg_model_t *)0x0;
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_jsgf2fsg.c"
              ,ln,pcVar4,pcVar3);
      goto LAB_001046f6;
    }
  }
  lmath = logmath_init(1.0001,0,0);
  fsg = jsgf_build_fsg_raw(grammar,rule,lmath,1.0);
LAB_001046f6:
  if (fsg == (fsg_model_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_jsgf2fsg.c"
            ,0xaa,
            "No fsg was built for the given rule \'%s\'.\nCheck rule name; it should be qualified (with grammar name)\nand not enclosed in angle brackets (e.g. \'grammar.rulename\')."
            ,pcVar2);
  }
  else {
    iVar1 = ps_config_bool(config,"compile");
    if (iVar1 != 0) {
      fsg_model_null_trans_closure(fsg,(glist_t)0x0);
    }
    pcVar2 = ps_config_str(config,"fsm");
    if (pcVar2 == (char *)0x0) {
      pcVar2 = ps_config_str(config,"fsg");
      if (pcVar2 == (char *)0x0) {
        fsg_model_write(fsg,_stdout);
      }
      else {
        fsg_model_writefile(fsg,pcVar2);
      }
    }
    else {
      pcVar2 = ps_config_str(config,"fsm");
      pcVar3 = ps_config_str(config,"symtab");
      if (pcVar2 == (char *)0x0) {
        fsg_model_write_fsm(fsg,_stdout);
      }
      else {
        fsg_model_writefile_fsm(fsg,pcVar2);
      }
      if (pcVar3 != (char *)0x0) {
        fsg_model_writefile_symtab(fsg,pcVar3);
      }
    }
    fsg_model_free(fsg);
    jsgf_grammar_free(grammar);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
main(int argc, char *argv[])
{
    jsgf_t *jsgf;
    fsg_model_t *fsg;
    cmd_ln_t *config;
    const char *rule, *loglevel;
        
    if ((config = cmd_ln_parse_r(NULL, defn, argc, argv, TRUE)) == NULL) {
        /* This probably just means that we got no arguments. */
        err_set_loglevel(ERR_INFO);
        cmd_ln_log_help_r(NULL, defn);
        return 1;
    }

    if (ps_config_bool(config, "help")) {
        usagemsg(argv[0]);
    }

    loglevel = ps_config_str(config, "loglevel");
    if (loglevel) {
        if (err_set_loglevel_str(loglevel) == NULL) {
            E_ERROR("Invalid log level: %s\n", loglevel);
            return -1;
        }
    }

    jsgf = jsgf_parse_file(ps_config_str(config, "jsgf"), NULL);
    if (jsgf == NULL) {
        return 1;
    }

    rule = ps_config_str(config, "toprule") ? ps_config_str(config, "toprule") : NULL;
    if (!(fsg = get_fsg(jsgf, rule))) {
        E_ERROR("No fsg was built for the given rule '%s'.\n"
                "Check rule name; it should be qualified (with grammar name)\n"
                "and not enclosed in angle brackets (e.g. 'grammar.rulename').",
                rule);
        return 1;
    }


    if (ps_config_bool(config, "compile")) {
	fsg_model_null_trans_closure(fsg, NULL);
    }

    
    if (ps_config_str(config, "fsm")) {
	const char* outfile = ps_config_str(config, "fsm");
	const char* symfile = ps_config_str(config, "symtab");
        if (outfile)
            fsg_model_writefile_fsm(fsg, outfile);
        else
            fsg_model_write_fsm(fsg, stdout);
        if (symfile)
            fsg_model_writefile_symtab(fsg, symfile);
    }
    else {
        const char *outfile = ps_config_str(config, "fsg");
        if (outfile)
            fsg_model_writefile(fsg, outfile);
        else
            fsg_model_write(fsg, stdout);
    }
    fsg_model_free(fsg);
    jsgf_grammar_free(jsgf);

    return 0;
}